

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepInnerStepper_SetAccumulatedErrorResetFn
              (MRIStepInnerStepper stepper,MRIStepInnerResetAccumulatedError fn)

{
  undefined8 in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x1146,"MRIStepInnerStepper_SetAccumulatedErrorResetFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper memory is NULL");
    local_4 = -0x16;
  }
  else if (*(long *)(in_RDI + 8) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x114d,"MRIStepInnerStepper_SetAccumulatedErrorResetFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Inner stepper operations structure is NULL");
    local_4 = -0x16;
  }
  else {
    *(undefined8 *)(*(long *)(in_RDI + 8) + 0x20) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepInnerStepper_SetAccumulatedErrorResetFn(
  MRIStepInnerStepper stepper, MRIStepInnerResetAccumulatedError fn)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  if (stepper->ops == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Inner stepper operations structure is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->ops->reseterror = fn;

  return ARK_SUCCESS;
}